

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall Time::Time(Time *this,Time *other)

{
  Time *other_local;
  Time *this_local;
  
  this->sec = other->sec;
  this->min = other->min;
  this->hour = other->hour;
  this->day = other->day;
  this->month = other->month;
  this->year = other->year;
  this->wday = other->wday;
  this->yday = other->yday;
  this->dst = (bool)(other->dst & 1);
  this->utc = (bool)(other->utc & 1);
  return;
}

Assistant:

Time::Time(const Time& other) :
  sec(other.sec),
  min(other.min),
  hour(other.hour),
  day(other.day),
  month(other.month),
  year(other.year),
  wday(other.wday),
  yday(other.yday),
  dst(other.dst),
  utc(other.utc) {}